

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O0

void __thiscall
inipp::Ini<char>::parse(Ini<char> *this,basic_istream<char,_std::char_traits<char>_> *is)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  bool bVar1;
  uint uVar2;
  istream *piVar3;
  element_type *peVar4;
  char *pcVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  bool local_1a1;
  _Self local_158;
  _Self local_150;
  map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_148;
  mapped_type *sec;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  undefined1 local_128 [8];
  String value;
  undefined1 local_f0 [8];
  String variable;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  string local_c0 [32];
  char *local_a0;
  value_type *front;
  char *local_90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pos;
  size_type length;
  locale local_60 [8];
  locale loc;
  String section;
  String line;
  basic_istream<char,_std::char_traits<char>_> *is_local;
  Ini<char> *this_local;
  
  std::__cxx11::string::string((string *)(section.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&loc);
  std::locale::locale(local_60,"C");
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)is,(string *)(section.field_2._M_local_buf + 8));
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    detail::ltrim<char>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&section.field_2 + 8),local_60);
    detail::rtrim<char>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&section.field_2 + 8),local_60);
    pos._M_current = (char *)std::__cxx11::string::length();
    if (pos._M_current != (char *)0x0) {
      local_88._M_current = (char *)std::__cxx11::string::begin();
      local_90 = (char *)std::__cxx11::string::end();
      front = (value_type *)this;
      local_80 = std::
                 find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,inipp::Ini<char>::parse(std::istream&)::_lambda(char)_1_>
                           (local_88,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )local_90,(anon_class_8_1_8991fb9c_for__M_pred)this);
      local_a0 = (char *)std::__cxx11::string::front();
      peVar4 = std::
               __shared_ptr_access<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->format);
      uVar2 = (*peVar4->_vptr_Format[3])(peVar4,(ulong)(uint)(int)*local_a0);
      if ((uVar2 & 1) == 0) {
        peVar4 = std::
                 __shared_ptr_access<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->format);
        uVar2 = (**peVar4->_vptr_Format)(peVar4,(ulong)(uint)(int)*local_a0);
        if ((uVar2 & 1) == 0) {
          local_c8._M_current = (char *)std::__cxx11::string::begin();
          bVar1 = __gnu_cxx::operator!=(&local_80,&local_c8);
          local_1a1 = false;
          if (bVar1) {
            variable.field_2._8_8_ = std::__cxx11::string::end();
            local_1a1 = __gnu_cxx::operator!=
                                  (&local_80,
                                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)((long)&variable.field_2 + 8));
          }
          if (local_1a1 == false) {
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->errors,(value_type *)((long)&section.field_2 + 8));
          }
          else {
            __beg._M_current = (char *)std::__cxx11::string::begin();
            __end._M_current = local_80._M_current;
            std::allocator<char>::allocator();
            std::__cxx11::string::
            string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                      ((string *)local_f0,__beg,__end,
                       (allocator<char> *)(value.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator((allocator<char> *)(value.field_2._M_local_buf + 0xf));
            local_130 = __gnu_cxx::
                        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator+(&local_80,1);
            local_138._M_current = (char *)std::__cxx11::string::end();
            std::allocator<char>::allocator();
            std::__cxx11::string::
            string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                      ((string *)local_128,local_130,local_138,(allocator<char> *)((long)&sec + 7));
            std::allocator<char>::~allocator((allocator<char> *)((long)&sec + 7));
            detail::rtrim<char>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_f0,local_60);
            detail::ltrim<char>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_128,local_60);
            local_148 = (map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                         *)std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                           ::operator[](&this->sections,(key_type *)&loc);
            local_150._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_148,(key_type *)local_f0);
            local_158._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_148);
            bVar1 = std::operator==(&local_150,&local_158);
            if (bVar1) {
              std::
              map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::emplace<std::__cxx11::string&,std::__cxx11::string&>
                        (local_148,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_128);
            }
            else {
              std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&this->errors,(value_type *)((long)&section.field_2 + 8));
            }
            std::__cxx11::string::~string((string *)local_128);
            std::__cxx11::string::~string((string *)local_f0);
          }
        }
        else {
          peVar4 = std::
                   __shared_ptr_access<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->format);
          pcVar5 = (char *)std::__cxx11::string::back();
          uVar2 = (*peVar4->_vptr_Format[1])(peVar4,(ulong)(uint)(int)*pcVar5);
          if ((uVar2 & 1) == 0) {
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->errors,(value_type *)((long)&section.field_2 + 8));
          }
          else {
            std::__cxx11::string::substr((ulong)local_c0,(ulong)((long)&section.field_2 + 8));
            std::__cxx11::string::operator=((string *)&loc,local_c0);
            std::__cxx11::string::~string(local_c0);
          }
        }
      }
    }
  }
  std::locale::~locale(local_60);
  std::__cxx11::string::~string((string *)&loc);
  std::__cxx11::string::~string((string *)(section.field_2._M_local_buf + 8));
  return;
}

Assistant:

void parse(std::basic_istream<CharT> & is) {
		String line;
		String section;
		const std::locale loc{"C"};
		while (std::getline(is, line)) {
			detail::ltrim(line, loc);
			detail::rtrim(line, loc);
			const auto length = line.length();
			if (length > 0) {
				const auto pos = std::find_if(line.begin(), line.end(), [this](CharT ch) { return format->is_assign(ch); });
				const auto & front = line.front();
				if (format->is_comment(front)) {
				}
				else if (format->is_section_start(front)) {
					if (format->is_section_end(line.back()))
						section = line.substr(1, length - 2);
					else
						errors.push_back(line);
				}
				else if (pos != line.begin() && pos != line.end()) {
					String variable(line.begin(), pos);
					String value(pos + 1, line.end());
					detail::rtrim(variable, loc);
					detail::ltrim(value, loc);
					auto & sec = sections[section];
					if (sec.find(variable) == sec.end())
						sec.emplace(variable, value);
					else
						errors.push_back(line);
				}
				else {
					errors.push_back(line);
				}
			}
		}
	}